

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

ssize_t hpeek(hFILE *fp,void *buffer,size_t nbytes)

{
  size_t sVar1;
  char cVar2;
  size_t sVar3;
  size_t unaff_R12;
  ulong uVar4;
  
  uVar4 = (long)fp->end - (long)fp->begin;
  do {
    if (nbytes <= uVar4) goto LAB_00110f90;
    sVar1 = refill_buffer(fp);
    cVar2 = (sVar1 == 0) * '\x03';
    sVar3 = 0;
    if (0 < (long)sVar1) {
      sVar3 = sVar1;
    }
    if ((long)sVar1 < 0) {
      cVar2 = '\x01';
      unaff_R12 = sVar1;
    }
    uVar4 = uVar4 + sVar3;
  } while (cVar2 == '\0');
  if (cVar2 == '\x03') {
LAB_00110f90:
    unaff_R12 = nbytes;
    if (uVar4 < nbytes) {
      unaff_R12 = uVar4;
    }
    memcpy(buffer,fp->begin,unaff_R12);
  }
  return unaff_R12;
}

Assistant:

ssize_t hpeek(hFILE *fp, void *buffer, size_t nbytes)
{
    size_t n = fp->end - fp->begin;
    while (n < nbytes) {
        ssize_t ret = refill_buffer(fp);
        if (ret < 0) return ret;
        else if (ret == 0) break;
        else n += ret;
    }

    if (n > nbytes) n = nbytes;
    memcpy(buffer, fp->begin, n);
    return n;
}